

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5SentenceFinderCb
              (void *pContext,int tflags,char *pToken,int nToken,int iStartOff,int iEndOff)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  Fts5SFinder *p;
  int iAdd;
  uint uVar8;
  
  if ((tflags & 1U) != 0) {
    return 0;
  }
  iAdd = *pContext;
  if (iAdd < 1) {
    iAdd = 0;
  }
  else {
    uVar8 = iStartOff - 1;
    uVar2 = 0xffffffff;
    if ((int)uVar8 < -1) {
      uVar2 = uVar8;
    }
    uVar5 = 0;
    for (uVar6 = uVar8; uVar4 = (uint)uVar5, uVar7 = uVar2, -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      bVar1 = *(byte *)(*(long *)((long)pContext + 0x18) + (ulong)uVar6);
      uVar5 = (ulong)bVar1;
      uVar4 = (uint)bVar1;
      uVar7 = uVar6;
      if ((0x20 < uVar5) || ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0)) break;
    }
    iVar3 = 0;
    if ((uVar7 == uVar8) || (((char)uVar4 != ':' && (iVar3 = 0, uVar4 != 0x2e)))) goto LAB_001c1bc0;
  }
  iVar3 = fts5SentenceFinderAdd((Fts5SFinder *)pContext,iAdd);
LAB_001c1bc0:
  *(int *)pContext = *pContext + 1;
  return iVar3;
}

Assistant:

static int fts5SentenceFinderCb(
  void *pContext,                 /* Pointer to HighlightContext object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iStartOff,                  /* Start offset of token */
  int iEndOff                     /* End offset of token */
){
  int rc = SQLITE_OK;

  UNUSED_PARAM2(pToken, nToken);
  UNUSED_PARAM(iEndOff);

  if( (tflags & FTS5_TOKEN_COLOCATED)==0 ){
    Fts5SFinder *p = (Fts5SFinder*)pContext;
    if( p->iPos>0 ){
      int i;
      char c = 0;
      for(i=iStartOff-1; i>=0; i--){
        c = p->zDoc[i];
        if( c!=' ' && c!='\t' && c!='\n' && c!='\r' ) break;
      }
      if( i!=iStartOff-1 && (c=='.' || c==':') ){
        rc = fts5SentenceFinderAdd(p, p->iPos);
      }
    }else{
      rc = fts5SentenceFinderAdd(p, 0);
    }
    p->iPos++;
  }
  return rc;
}